

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

void __thiscall
CMU462::HalfedgeMesh::build
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *this_00;
  undefined8 *puVar1;
  unsigned_long uVar2;
  HalfedgeMesh *pHVar3;
  _Base_ptr p_Var4;
  pointer pVVar5;
  undefined8 uVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *pvVar9;
  _Self __tmp;
  pointer puVar10;
  iterator iVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  iterator iVar14;
  mapped_type *pmVar15;
  EdgeIter EVar16;
  _List_node_base *p_Var17;
  FaceIter FVar18;
  _List_node_base *p_Var19;
  _Base_ptr p_Var20;
  ostream *poVar21;
  HalfedgeMesh *pHVar22;
  long lVar23;
  long lVar24;
  HalfedgeMesh *pHVar25;
  mapped_type mVar26;
  pointer pvVar27;
  ulong uVar28;
  ulong uVar29;
  IndexListCIter i;
  pointer puVar30;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *pvVar31;
  long lVar32;
  HalfedgeIter hab;
  VertexIter v;
  IndexPair ab;
  Index a;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *local_e8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_e0;
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  pairToHalfedge;
  IndexPair ba;
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  indexToVertex;
  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  vertexDegree;
  
  local_e8 = vertexPositions;
  std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::clear(&this->halfedges);
  this_00 = &this->vertices;
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::clear(this_00);
  std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::clear(&this->edges);
  p_Var19 = (_List_node_base *)&this->faces;
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)p_Var19);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear(&this->boundaries);
  indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header;
  indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  indexToVertex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header;
  vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0 = polygons;
  indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vertexDegree._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pvVar27 = (polygons->
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; pvVar31 = local_e0,
      pvVar27 !=
      (local_e0->
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pvVar27 = pvVar27 + 1) {
    puVar30 = (pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar10 = (pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ulong)((long)puVar10 - (long)puVar30) < 0x11) {
      poVar21 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: each polygon must have at least three vertices."
                               );
      std::endl<char,std::char_traits<char>>(poVar21);
      goto LAB_00187298;
    }
    pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header;
    pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (; puVar30 != puVar10; puVar30 = puVar30 + 1) {
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::_M_insert_unique<unsigned_long_const&>
                ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                  *)&pairToHalfedge,puVar30);
      iVar11 = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
               ::find(&indexToVertex._M_t,puVar30);
      if ((_Rb_tree_header *)iVar11._M_node == &indexToVertex._M_t._M_impl.super__Rb_tree_header) {
        v = newVertex(this);
        v._M_node[0xf]._M_prev = (_List_node_base *)this;
        pmVar12 = std::
                  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                  ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                *)&indexToVertex._M_t,puVar30);
        pmVar12->_M_node = v._M_node;
        pmVar13 = std::
                  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                  ::operator[](&vertexDegree,&v);
        *pmVar13 = 1;
      }
      else {
        pmVar12 = std::
                  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                  ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                *)&indexToVertex._M_t,puVar30);
        pmVar13 = std::
                  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                  ::operator[](&vertexDegree,pmVar12);
        *pmVar13 = *pmVar13 + 1;
      }
      puVar10 = (pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_finish;
    }
    if (pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_node_count <
        (ulong)((long)puVar10 -
                (long)(pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3)) {
      poVar21 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: one of the input polygons does not have distinct vertices!"
                               );
      std::endl<char,std::char_traits<char>>(poVar21);
      std::operator<<((ostream *)&std::cerr,"(vertex indices:");
      for (puVar30 = (pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          puVar30 !=
          (pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish; puVar30 = puVar30 + 1) {
        poVar21 = std::operator<<((ostream *)&std::cerr," ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
      }
      poVar21 = std::operator<<((ostream *)&std::cerr,")");
      std::endl<char,std::char_traits<char>>(poVar21);
      goto LAB_00187298;
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 *)&pairToHalfedge);
  }
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::resize
            ((list<CMU462::Face,_std::allocator<CMU462::Face>_> *)p_Var19,
             ((long)pvVar27 -
             (long)(local_e0->
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header;
  pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar27 = (pvVar31->
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pairToHalfedge._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (; p_Var17 = (_List_node_base *)this_00,
      pvVar27 !=
      (pvVar31->
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish; pvVar27 = pvVar27 + 1) {
    p_Var19 = (((_List_base<CMU462::Face,_std::allocator<CMU462::Face>_> *)&p_Var19->_M_next)->
              _M_impl)._M_node.super__List_node_base._M_next;
    v._M_node = (_List_node_base *)0x0;
    lVar32 = (long)(pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    for (lVar24 = 1; -lVar32 + lVar24 != 1; lVar24 = lVar24 + 1) {
      puVar30 = (pvVar27->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start;
      ab.first = puVar30[lVar24 + -1];
      lVar23 = 0;
      if (lVar24 != lVar32) {
        lVar23 = lVar24;
      }
      uVar2 = puVar30[lVar23];
      hab._M_node = (_List_node_base *)0x0;
      ab.second = uVar2;
      a = ab.first;
      iVar14 = std::
               _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::find(&pairToHalfedge._M_t,&ab);
      if ((_Rb_tree_header *)iVar14._M_node != &pairToHalfedge._M_t._M_impl.super__Rb_tree_header) {
        poVar21 = std::operator<<((ostream *)&std::cerr,
                                  "Error converting polygons to halfedge mesh: found multiple oriented edges with indices ("
                                 );
        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
        poVar21 = std::operator<<(poVar21,", ");
        poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
        poVar21 = std::operator<<(poVar21,").");
        std::endl<char,std::char_traits<char>>(poVar21);
        poVar21 = std::operator<<((ostream *)&std::cerr,
                                  "This means that either (i) more than two faces contain this edge (hence the surface is nonmanifold), or"
                                 );
        std::endl<char,std::char_traits<char>>(poVar21);
        poVar21 = std::operator<<((ostream *)&std::cerr,
                                  "(ii) there are exactly two faces containing this edge, but they have the same orientation (hence the surface is"
                                 );
        std::endl<char,std::char_traits<char>>(poVar21);
        poVar21 = std::operator<<((ostream *)&std::cerr,"not consistently oriented.");
        std::endl<char,std::char_traits<char>>(poVar21);
        goto LAB_00187298;
      }
      hab = newHalfedge(this);
      pmVar15 = std::
                map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                ::operator[]((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                              *)&pairToHalfedge._M_t,&ab);
      pmVar15->_M_node = hab._M_node;
      hab._M_node[3]._M_prev = p_Var19;
      p_Var19[0xb]._M_prev = hab._M_node;
      pmVar12 = std::
                map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                ::operator[](&indexToVertex,&a);
      p_Var17 = pmVar12->_M_node;
      hab._M_node[2]._M_prev = p_Var17;
      p_Var17[0xf]._M_prev = hab._M_node;
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)&v,&hab);
      ba.second = a;
      ba.first = uVar2;
      iVar14 = std::
               _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::find(&pairToHalfedge._M_t,&ba);
      if ((_Rb_tree_header *)iVar14._M_node == &pairToHalfedge._M_t._M_impl.super__Rb_tree_header) {
        hab._M_node[1]._M_prev = (_List_node_base *)this;
      }
      else {
        p_Var20 = iVar14._M_node[1]._M_left;
        hab._M_node[1]._M_prev = (_List_node_base *)p_Var20;
        p_Var20->_M_right = (_Base_ptr)hab._M_node;
        EVar16 = newEdge(this);
        hab._M_node[3]._M_next = EVar16._M_node;
        p_Var20[1]._M_left = (_Base_ptr)EVar16._M_node;
        EVar16._M_node[6]._M_prev = hab._M_node;
      }
    }
    for (lVar24 = 1; -lVar32 + lVar24 != 1; lVar24 = lVar24 + 1) {
      lVar23 = lVar24;
      if (lVar24 == lVar32) {
        lVar23 = 0;
      }
      *(_List_node_base **)(*(long *)((long)v._M_node + lVar24 * 8 + -8) + 0x20) =
           (&(v._M_node)->_M_next)[lVar23];
    }
    std::
    _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::~_Vector_base((_Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                     *)&v);
    pvVar31 = local_e0;
  }
LAB_00186edc:
  p_Var17 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)&p_Var17->_M_next)->
            _M_impl)._M_node.super__List_node_base._M_next;
  if (p_Var17 != (_List_node_base *)this_00) {
    p_Var19 = p_Var17[0xf]._M_prev;
    do {
      if ((HalfedgeMesh *)p_Var19[1]._M_prev == this) {
        p_Var17[0xf]._M_prev = p_Var19;
        break;
      }
      p_Var19 = (((HalfedgeMesh *)p_Var19[1]._M_prev)->vertices).
                super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                super__List_node_base._M_prev;
    } while (p_Var17[0xf]._M_prev != p_Var19);
    goto LAB_00186edc;
  }
  pHVar25 = this;
  while (pHVar25 = (HalfedgeMesh *)
                   (pHVar25->halfedges).
                   super__List_base<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>._M_impl.
                   _M_node.super__List_node_base._M_next, p_Var19 = (_List_node_base *)this_00,
        pHVar25 != this) {
    if ((HalfedgeMesh *)
        (pHVar25->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
        _M_impl._M_node.super__List_node_base._M_next == this) {
      FVar18 = newBoundary(this);
      v._M_node = (_List_node_base *)0x0;
      pHVar22 = pHVar25;
LAB_00186f43:
      ab.first = (unsigned_long)newHalfedge(this);
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)&v,(value_type *)&ab);
      (pHVar22->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
      _M_node.super__List_node_base._M_next = (_List_node_base *)ab.first;
      *(HalfedgeMesh **)(ab.first + 0x18) = pHVar22;
      *(_List_node_base **)(ab.first + 0x38) = FVar18._M_node;
      *(_List_node_base **)(ab.first + 0x28) =
           (pHVar22->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>.
           _M_impl._M_node.super__List_node_base._M_prev[2]._M_prev;
      EVar16 = newEdge(this);
      EVar16._M_node[6]._M_prev = (_List_node_base *)pHVar22;
      (pHVar22->edges).super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>._M_impl._M_node
      .super__List_node_base._M_next = EVar16._M_node;
      *(_List_node_base **)(ab.first + 0x30) = EVar16._M_node;
      pHVar3 = pHVar22;
      while (pHVar22 = (HalfedgeMesh *)
                       (pHVar3->vertices).
                       super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl.
                       _M_node.super__List_node_base._M_prev, pHVar25 != pHVar22) {
        pHVar3 = (HalfedgeMesh *)
                 (pHVar22->vertices).
                 super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                 super__List_node_base._M_next;
        if (pHVar3 == this) goto LAB_00186f43;
      }
      FVar18._M_node[0xb]._M_prev = (v._M_node)->_M_next;
      uVar28 = -(long)v._M_node >> 3;
      for (uVar29 = 0; uVar28 != uVar29; uVar29 = uVar29 + 1) {
        (&(v._M_node)->_M_next)[uVar29][2]._M_next =
             (&(v._M_node)->_M_next)[((uVar28 - 1) + uVar29) % uVar28];
      }
      std::
      _Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::~_Vector_base((_Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                       *)&v);
    }
  }
  while (p_Var19 = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                    &p_Var19->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var19 != (_List_node_base *)this_00) {
    p_Var19[0xf]._M_prev = p_Var19[0xf]._M_prev[1]._M_prev[2]._M_next;
  }
  v._M_node = (_List_node_base *)this_00;
  do {
    pvVar9 = local_e8;
    v._M_node = (((_List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *)
                 &(v._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (v._M_node == (_List_node_base *)this_00) {
      if ((this->vertices).super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl
          ._M_node._M_size <=
          (ulong)(((long)(local_e8->
                         super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_e8->
                        super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>).
                        _M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        lVar24 = 0;
        p_Var20 = indexToVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while ((_Rb_tree_header *)p_Var20 != &indexToVertex._M_t._M_impl.super__Rb_tree_header) {
          p_Var4 = p_Var20[1]._M_parent;
          pVVar5 = (pvVar9->super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>)
                   ._M_impl.super__Vector_impl_data._M_start;
          p_Var4[1]._M_parent = *(_Base_ptr *)((long)&pVVar5->z + lVar24);
          puVar1 = (undefined8 *)((long)&pVVar5->x + lVar24);
          uVar6 = puVar1[1];
          p_Var4->_M_right = (_Base_ptr)*puVar1;
          *(undefined8 *)(p_Var4 + 1) = uVar6;
          puVar1 = (undefined8 *)((long)&pVVar5->x + lVar24);
          p_Var7 = (_Base_ptr)*puVar1;
          p_Var8 = (_Base_ptr)puVar1[1];
          *(undefined8 *)(p_Var4 + 2) = *(undefined8 *)((long)&pVVar5->z + lVar24);
          p_Var4[1]._M_left = p_Var7;
          p_Var4[1]._M_right = p_Var8;
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
          lVar24 = lVar24 + 0x18;
        }
        std::
        _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
        ::~_Rb_tree(&pairToHalfedge._M_t);
        std::
        _Rb_tree<std::_List_iterator<CMU462::Vertex>,_std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>,_std::_Select1st<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
        ::~_Rb_tree(&vertexDegree._M_t);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
        ::~_Rb_tree(&indexToVertex._M_t);
        return;
      }
      poVar21 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: number of vertex positions is different from the number of distinct vertices!"
                               );
      std::endl<char,std::char_traits<char>>(poVar21);
      poVar21 = std::operator<<((ostream *)&std::cerr,"(number of positions in input: ");
      poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
      poVar21 = std::operator<<(poVar21,")");
      std::endl<char,std::char_traits<char>>(poVar21);
      poVar21 = std::operator<<((ostream *)&std::cerr,"(  number of vertices in mesh: ");
      poVar21 = std::ostream::_M_insert<unsigned_long>((ulong)poVar21);
      poVar21 = std::operator<<(poVar21,")");
      std::endl<char,std::char_traits<char>>(poVar21);
      goto LAB_00187298;
    }
    pHVar25 = (HalfedgeMesh *)v._M_node[0xf]._M_prev;
    if (pHVar25 == this) {
      poVar21 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: some vertices are not referenced by any polygon."
                               );
      std::endl<char,std::char_traits<char>>(poVar21);
      goto LAB_00187298;
    }
    mVar26 = 0;
    pHVar22 = pHVar25;
    do {
      mVar26 = mVar26 + ((ulong)*(byte *)&(pHVar22->edges).
                                          super__List_base<CMU462::Edge,_std::allocator<CMU462::Edge>_>
                                          ._M_impl._M_node.super__List_node_base._M_prev[0xc].
                                          _M_next ^ 1);
      pHVar22 = (HalfedgeMesh *)
                (pHVar22->vertices).
                super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>._M_impl._M_node.
                super__List_node_base._M_next[2]._M_next;
    } while (pHVar22 != pHVar25);
    pmVar13 = std::
              map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
              ::operator[](&vertexDegree,&v);
  } while (mVar26 == *pmVar13);
  poVar21 = std::operator<<((ostream *)&std::cerr,
                            "Error converting polygons to halfedge mesh: at least one of the vertices is nonmanifold."
                           );
  std::endl<char,std::char_traits<char>>(poVar21);
LAB_00187298:
  exit(1);
}

Assistant:

void HalfedgeMesh::build(const vector<vector<Index> >& polygons,
      const vector<Vector3D>& vertexPositions)
    // This method initializes the halfedge data structure from a raw list of
    // polygons, where each input polygon is specified as a list of vertex indices.
    // The input must describe a manifold, oriented surface, where the orientation
    // of a polygon is determined by the order of vertices in the list. Polygons
    // must have at least three vertices.  Note that there are no special conditions
    // on the vertex indices, i.e., they do not have to start at 0 or 1, nor does
    // the collection of indices have to be contiguous.  Overall, this initializer
    // is designed to be robust but perhaps not incredibly fast (though of course
    // this does not affect the performance of the resulting data structure).  One
    // could also implement faster initializers that handle important special cases
    // (e.g., all triangles, or data that is known to be manifold). Since there are
    // no strong conditions on the indices of polygons, we assume that the list of
    // vertex positions is given in lexicographic order (i.e., that the lowest index
    // appearing in any polygon corresponds to the first entry of the list of
    // positions and so on).
  {
    // define some types, to improve readability
    typedef vector<Index> IndexList;
    typedef IndexList::const_iterator IndexListCIter;
    typedef vector<IndexList> PolygonList;
    typedef PolygonList::const_iterator PolygonListCIter;
    typedef pair<Index, Index> IndexPair;  // ordered pair of vertex indices,
    // corresponding to an edge of an
    // oriented polygon

    // Clear any existing elements.
    halfedges.clear();
    vertices.clear();
    edges.clear();
    faces.clear();
    boundaries.clear();

    // Since the vertices in our halfedge mesh are stored in a linked list,
    // we will temporarily need to keep track of the correspondence between
    // indices of vertices in our input and pointers to vertices in the new
    // mesh (which otherwise can't be accessed by index).  Note that since
    // we're using a general-purpose map (rather than, say, a vector), we can
    // be a bit more flexible about the indexing scheme: input vertex indices
    // aren't required to be 0-based or 1-based; in fact, the set of indices
    // doesn't even have to be contiguous.  Taking advantage of this fact makes
    // our conversion a bit more robust to different types of input, including
    // data that comes from a subset of a full mesh.

    // maps a vertex index to the corresponding vertex
    map<Index, VertexIter> indexToVertex;

    // Also store the vertex degree, i.e., the number of polygons that use each
    // vertex; this information will be used to check that the mesh is manifold.
    map<VertexIter, Size> vertexDegree;

    // First, we do some basic sanity checks on the input.
    for (PolygonListCIter p = polygons.begin(); p != polygons.end(); p++) {
      if (p->size() < 3) {
        // Refuse to build the mesh if any of the polygons have fewer than three
        // vertices.(Note that if we omit this check the code will still
        // constructsomething fairlymeaningful for 1- and 2-point polygons, but
        // enforcing this stricterrequirementon the input will help simplify code
        // further downstream, since it canbe certainit doesn't have to check for
        // these rather degenerate cases.)
        cerr << "Error converting polygons to halfedge mesh: each polygon must "
          "have at least three vertices." << endl;
        exit(1);
      }

      // We want to count the number of distinct vertex indices in this
      // polygon, to make sure it's the same as the number of vertices
      // in the polygon---if they disagree, then the polygon is not valid
      // (or at least, for simplicity we don't handle polygons of this type!).
      set<Index> polygonIndices;

      // loop over polygon vertices
      for (IndexListCIter i = p->begin(); i != p->end(); i++) {
        polygonIndices.insert(*i);

        // allocate one vertex for each new index we encounter
        if (indexToVertex.find(*i) == indexToVertex.end()) {
          VertexIter v = newVertex();
          v->halfedge() =
            halfedges.end();  // this vertex doesn't yet point to any halfedge
          indexToVertex[*i] = v;
          vertexDegree[v] = 1;  // we've now seen this vertex only once
        } else {
          // keep track of the number of times we've seen this vertex
          vertexDegree[indexToVertex[*i]]++;
        }

      }  // end loop over polygon vertices

      // check that all vertices of the current polygon are distinct
      Size degree = p->size();  // number of vertices in this polygon
      if (polygonIndices.size() < degree) {
        cerr << "Error converting polygons to halfedge mesh: one of the input "
          "polygons does not have distinct vertices!" << endl;
        cerr << "(vertex indices:";
        for (IndexListCIter i = p->begin(); i != p->end(); i++) {
          cerr << " " << *i;
        }
        cerr << ")" << endl;
        exit(1);
      }  // end check that polygon vertices are distinct

    }  // end basic sanity checks on input

    // The number of vertices in the mesh is the
    // number of unique indices seen in the input.
    Size nVertices = indexToVertex.size();

    // The number of faces is just the number of polygons in the input.
    Size nFaces = polygons.size();
    faces.resize(nFaces);  // allocate storage for faces in our new mesh

    // We will store a map from ordered pairs of vertex indices to
    // the corresponding halfedge object in our new (halfedge) mesh;
    // this map gets constructed during the next loop over polygons.
    map<IndexPair, HalfedgeIter> pairToHalfedge;

    // Next, we actually build the halfedge connectivity by again looping over
    // polygons
    PolygonListCIter p;
    FaceIter f;
    for (p = polygons.begin(), f = faces.begin(); p != polygons.end(); p++, f++) {
      vector<HalfedgeIter> faceHalfedges;  // cyclically ordered list of the half
      // edges of this face
      Size degree = p->size();             // number of vertices in this polygon

      // loop over the halfedges of this face (equivalently, the ordered pairs of
      // consecutive vertices)
      for (Index i = 0; i < degree; i++) {
        Index a = (*p)[i];                 // current index
        Index b = (*p)[(i + 1) % degree];  // next index, in cyclic order
        IndexPair ab(a, b);
        HalfedgeIter hab;

        // check if this halfedge already exists; if so, we have a problem!
        if (pairToHalfedge.find(ab) != pairToHalfedge.end()) {
          cerr << "Error converting polygons to halfedge mesh: found multiple "
            "oriented edges with indices (" << a << ", " << b << ")."
            << endl;
          cerr << "This means that either (i) more than two faces contain this "
            "edge (hence the surface is nonmanifold), or" << endl;
          cerr << "(ii) there are exactly two faces containing this edge, but "
            "they have the same orientation (hence the surface is" << endl;
          cerr << "not consistently oriented." << endl;
          exit(1);
        } else  // otherwise, the halfedge hasn't been allocated yet
        {
          // so, we point this vertex pair to a new halfedge
          hab = newHalfedge();
          pairToHalfedge[ab] = hab;

          // link the new halfedge to its face
          hab->face() = f;
          hab->face()->halfedge() = hab;

          // also link it to its starting vertex
          hab->vertex() = indexToVertex[a];
          hab->vertex()->halfedge() = hab;

          // keep a list of halfedges in this face, so that we can later
          // link them together in a loop (via their "next" pointers)
          faceHalfedges.push_back(hab);
        }

        // Also, check if the twin of this halfedge has already been constructed
        // (during construction of a different face).  If so, link the twins
        // together and allocate their shared halfedge.  By the end of this pass
        // over polygons, the only halfedges that will not have a twin will hence
        // be those that sit along the domain boundary.
        IndexPair ba(b, a);
        map<IndexPair, HalfedgeIter>::iterator iba = pairToHalfedge.find(ba);
        if (iba != pairToHalfedge.end()) {
          HalfedgeIter hba = iba->second;

          // link the twins
          hab->twin() = hba;
          hba->twin() = hab;

          // allocate and link their edge
          EdgeIter e = newEdge();
          hab->edge() = e;
          hba->edge() = e;
          e->halfedge() = hab;
        } else { // If we didn't find a twin...
          // ...mark this halfedge as being twinless by pointing
          // it to the end of the list of halfedges. If it remains
          // twinless by the end of the current loop over polygons,
          // it will be linked to a boundary face in the next pass.
          hab->twin() = halfedges.end();
        }

      }  // end loop over the current polygon's halfedges

      // Now that all the halfedges of this face have been allocated,
      // we can link them together via their "next" pointers.
      for (Index i = 0; i < degree; i++) {
        Index j =
          (i + 1) % degree;  // index of the next halfedge, in cyclic order
        faceHalfedges[i]->next() = faceHalfedges[j];
      }

    }  // done building basic halfedge connectivity

    // For each vertex on the boundary, advance its halfedge pointer to one that
    // is also on the boundary.
    for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
      // loop over halfedges around vertex
      HalfedgeIter h = v->halfedge();
      do {
        if (h->twin() == halfedges.end()) {
          v->halfedge() = h;
          break;
        }

        h = h->twin()->next();
      } while (h != v->halfedge());  // end loop over halfedges around vertex

    }  // done advancing halfedge pointers for boundary vertices

    // Next we construct new faces for each boundary component.
    for (HalfedgeIter h = halfedgesBegin(); h != halfedgesEnd();
        h++)  // loop over all halfedges
    {
      // Any halfedge that does not yet have a twin is on the boundary of the
      // domain. If we follow the boundary around long enough we will of course
      // eventually make a closed loop; we can represent this boundary loop by a
      // new face. To make clear the distinction between faces and boundary loops,
      // the boundary face will (i) have a flag indicating that it is a boundary
      // loop, and (ii) be stored in a list of boundaries, rather than the usual
      // list of faces.  The reason we need the both the flag *and* the separate
      // list is that faces are often accessed in two fundamentally different
      // ways: either by (i) local traversal of the neighborhood of some mesh
      // element using the halfedge structure, or (ii) global traversal of all
      // faces (or boundary loops).
      if (h->twin() == halfedges.end()) {
        FaceIter b = newBoundary();
        vector<HalfedgeIter> boundaryHalfedges;  // keep a list of halfedges along
        // the boundary, so we can link
        // them together

        // We now need to walk around the boundary, creating new
        // halfedges and edges along the boundary loop as we go.
        HalfedgeIter i = h;
        do {
          // create a twin, which becomes a halfedge of the boundary loop
          HalfedgeIter t = newHalfedge();
          boundaryHalfedges.push_back(
              t);  // keep a list of all boundary halfedges, in cyclic order
          i->twin() = t;
          t->twin() = i;
          t->face() = b;
          t->vertex() = i->next()->vertex();

          // create the shared edge
          EdgeIter e = newEdge();
          e->halfedge() = i;
          i->edge() = e;
          t->edge() = e;

          // Advance i to the next halfedge along the current boundary loop
          // by walking around its target vertex and stopping as soon as we
          // find a halfedge that does not yet have a twin defined.
          i = i->next();
          while (i != h &&  // we're done if we end up back at the beginning of
              // the loop
              i->twin() != halfedges.end())  // otherwise, we're looking for
            // the next twinless halfedge
            // along the loop
          {
            i = i->twin();
            i = i->next();
          }
        } while (i != h);

        b->halfedge() = boundaryHalfedges.front();

        // The only pointers that still need to be set are the "next" pointers of
        // the twins; these we can set from the list of boundary halfedges, but we
        // must use the opposite order from the order in the list, since the
        // orientation of the boundary loop is opposite the orientation of the
        // halfedges "inside" the domain boundary.
        Size degree = boundaryHalfedges.size();
        for (Index p = 0; p < degree; p++) {
          Index q = (p - 1 + degree) % degree;
          boundaryHalfedges[p]->next() = boundaryHalfedges[q];
        }

      }  // end construction of one of the boundary loops

      // Note that even though we are looping over all halfedges, we will still
      // construct the appropriate number of boundary loops (and not, say, one
      // loop per boundary halfedge).  The reason is that as we continue to
      // iterate through halfedges, we check whether their twin has been assigned,
      // and since new twins may have been assigned earlier in this loop, we will
      // end up skipping many subsequent halfedges.

    }  // done adding "virtual" faces corresponding to boundary loops

    // To make later traversal of the mesh easier, we will now advance the
    // halfedge
    // associated with each vertex such that it refers to the *first* non-boundary
    // halfedge, rather than the last one.
    for (VertexIter v = verticesBegin(); v != verticesEnd(); v++) {
      v->halfedge() = v->halfedge()->twin()->next();
    }

    // Finally, we check that all vertices are manifold.
    for (VertexIter v = vertices.begin(); v != vertices.end(); v++) {
      // First check that this vertex is not a "floating" vertex;
      // if it is then we do not have a valid 2-manifold surface.
      if (v->halfedge() == halfedges.end()) {
        cerr << "Error converting polygons to halfedge mesh: some vertices are "
          "not referenced by any polygon." << endl;
        exit(1);
      }

      // Next, check that the number of halfedges emanating from this vertex in
      // our half edge data structure equals the number of polygons containing
      // this vertex, which we counted during our first pass over the mesh.  If
      // not, then our vertex is not a "fan" of polygons, but instead has some
      // other (nonmanifold) structure.
      Size count = 0;
      HalfedgeIter h = v->halfedge();
      do {
        if (!h->face()->isBoundary()) {
          count++;
        }
        h = h->twin()->next();
      } while (h != v->halfedge());

      if (count != vertexDegree[v]) {
        cerr << "Error converting polygons to halfedge mesh: at least one of the "
          "vertices is nonmanifold." << endl;
        exit(1);
      }
    }  // end loop over vertices

    // Now that we have the connectivity, we copy the list of vertex
    // positions into member variables of the individual vertices.
    if (vertexPositions.size() < vertices.size()) {
      cerr << "Error converting polygons to halfedge mesh: number of vertex "
        "positions is different from the number of distinct vertices!"
        << endl;
      cerr << "(number of positions in input: " << vertexPositions.size() << ")"
        << endl;
      cerr << "(  number of vertices in mesh: " << vertices.size() << ")" << endl;
      exit(1);
    }
    // Since an STL map internally sorts its keys, we can iterate over the map
    // from vertex indices to vertex iterators to visit our (input) vertices in
    // lexicographic order
    int i = 0;
    for (map<Index, VertexIter>::const_iterator e = indexToVertex.begin();
        e != indexToVertex.end(); e++) {
      // grab a pointer to the vertex associated with the current key (i.e., the
      // current index)
      VertexIter v = e->second;

      // set the att of this vertex to the corresponding
      // position in the input
      v->position = vertexPositions[i];
      v->bindPosition = v->position;
      i++;
    }

  }